

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall
UdpSocketImpl::Create(UdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  int *piVar4;
  UdpSocketImpl *pUStack_108;
  int iSocketErr;
  code *local_100;
  undefined8 local_f8;
  thread local_f0;
  UdpSocketImpl *local_e8;
  code *local_e0;
  undefined8 local_d8;
  thread local_d0;
  string local_c8;
  addrinfo *local_a8;
  addrinfo *lstBind;
  byte local_95;
  uint32_t on;
  bool bRet;
  string local_88;
  undefined1 auStack_68 [8];
  addrinfo hint;
  addrinfo *lstAddr;
  char *szIpToBind_local;
  uint16_t sPort_local;
  char *szIpToWhere_local;
  UdpSocketImpl *this_local;
  
  hint.ai_next = (addrinfo *)0x0;
  hint.ai_addr = (sockaddr *)0x0;
  hint.ai_canonname = (char *)0x0;
  hint.ai_socktype = 0;
  hint.ai_protocol = 0;
  hint.ai_addrlen = 0;
  hint._20_4_ = 0;
  hint.ai_flags = 2;
  hint.ai_family = 0;
  auStack_68._0_4_ = 1;
  auStack_68._4_4_ = 0;
  std::__cxx11::to_string(&local_88,(uint)sPort);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = getaddrinfo(szIpToWhere,pcVar2,(addrinfo *)auStack_68,(addrinfo **)&hint.ai_next);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar1 == 0) {
    local_95 = 1;
    iVar1 = socket((hint.ai_next)->ai_family,(hint.ai_next)->ai_socktype,(hint.ai_next)->ai_protocol
                  );
    (this->super_BaseSocketImpl).m_fSock = iVar1;
    if ((this->super_BaseSocketImpl).m_fSock == -1) {
      piVar3 = (int *)__cxa_allocate_exception(4);
      piVar4 = __errno_location();
      *piVar3 = *piVar4;
      __cxa_throw(piVar3,&int::typeinfo,0);
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])
              (this,&(this->super_BaseSocketImpl).m_fSock);
    if ((hint.ai_next)->ai_family == 10) {
      lstBind._4_4_ = 0;
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x1a,(void *)((long)&lstBind + 4)
                         ,4);
      if (iVar1 == -1) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
    }
    if (szIpToBind == (char *)0x0) {
      iVar1 = bind((this->super_BaseSocketImpl).m_fSock,(sockaddr *)(hint.ai_next)->ai_addr,
                   (hint.ai_next)->ai_addrlen);
      if (iVar1 < 0) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
    }
    else {
      std::__cxx11::to_string(&local_c8,(uint)sPort);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = getaddrinfo(szIpToBind,pcVar2,(addrinfo *)0x0,&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (iVar1 != 0) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
      iVar1 = bind((this->super_BaseSocketImpl).m_fSock,local_a8->ai_addr,local_a8->ai_addrlen);
      if (iVar1 < 0) {
        freeaddrinfo(local_a8);
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
      freeaddrinfo(local_a8);
    }
    local_e0 = SelectThread;
    local_d8 = 0;
    local_e8 = this;
    std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
              (&local_d0,(type *)&local_e0,&local_e8);
    std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&local_d0);
    std::thread::~thread(&local_d0);
    local_100 = WriteThread;
    local_f8 = 0;
    pUStack_108 = this;
    std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
              (&local_f0,(type *)&local_100,&stack0xfffffffffffffef8);
    std::thread::operator=(&(this->super_BaseSocketImpl).m_thWrite,&local_f0);
    std::thread::~thread(&local_f0);
    freeaddrinfo((addrinfo *)hint.ai_next);
    this_local._7_1_ = (bool)(local_95 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UdpSocketImpl::Create(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_DGRAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        if (szIpToBind != nullptr)
        {
            struct addrinfo *lstBind;
            if (::getaddrinfo(szIpToBind, to_string(sPort).c_str(), nullptr, &lstBind) != 0)
                throw WSAGetLastError();

            if (::bind(m_fSock, lstBind->ai_addr, static_cast<int>(lstBind->ai_addrlen)) < 0)
            {
                ::freeaddrinfo(lstBind);
                throw WSAGetLastError();
            }
            ::freeaddrinfo(lstBind);
        }
        else
        {
            if (::bind(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();
        }

        m_thListen = thread(&UdpSocketImpl::SelectThread, this);
        m_thWrite = thread(&UdpSocketImpl::WriteThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}